

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O2

void __thiscall GGSock::Communicator::Data::doRead(Data *this)

{
  TSocketDescriptor *sock;
  uint uVar1;
  bool bVar2;
  int iVar3;
  ssize_t sVar4;
  int *piVar5;
  mapped_type *this_00;
  uint uVar6;
  char *__args;
  TMessageType local_2a;
  
  sock = &this->sdpeer;
  sVar4 = recv(this->sdpeer,&this->bufferHeaderRecv,6,0);
  iVar3 = (int)sVar4;
  if (iVar3 < 0) {
    bVar2 = anon_unknown.dwarf_7a85::e_wouldBlock();
    if (bVar2) {
      return;
    }
    this->isConnected = false;
  }
  else {
    if (iVar3 == 6) {
      uVar6 = *(uint *)(this->bufferHeaderRecv)._M_elems;
      local_2a = *(TMessageType *)((this->bufferHeaderRecv)._M_elems + 4);
      if (uVar6 == 6) {
        this_00 = std::
                  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                  ::operator[](&this->messageCallback,&local_2a);
        if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0) {
          return;
        }
        __args = (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar6 = 0;
      }
      else {
        if (uVar6 < 7) {
          return;
        }
        this->lastMessageType = local_2a;
        uVar6 = uVar6 - 6;
        this->leftToReceive = uVar6;
        this->offsetReceive = 0;
        if (*(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
            *(int *)&(this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start < (int)uVar6) {
          printf("Extend receive buffer to %d bytes\n");
          std::vector<char,_std::allocator<char>_>::resize
                    (&this->bufferDataRecv,(long)this->leftToReceive);
        }
        do {
          while( true ) {
            uVar1 = this->leftToReceive;
            if ((int)uVar1 < 1) goto LAB_0010fed3;
            if (0xffff < uVar1) {
              uVar1 = 0x10000;
            }
            sVar4 = recv(this->sdpeer,
                         (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>.
                         _M_impl.super__Vector_impl_data._M_start + this->offsetReceive,(ulong)uVar1
                         ,0);
            iVar3 = (int)sVar4;
            if (iVar3 < 0) break;
            if (iVar3 == 0) {
              this->isListening = false;
              this->isConnected = false;
              anon_unknown.dwarf_7a85::closeAndReset(sock);
              anon_unknown.dwarf_7a85::closeAndReset(&this->sd);
              if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
                return;
              }
              piVar5 = __errno_location();
              std::function<void_(short)>::operator()(&this->errorCallback,(short)*piVar5);
              return;
            }
            this->leftToReceive = this->leftToReceive - iVar3;
            this->offsetReceive = this->offsetReceive + iVar3;
          }
          bVar2 = anon_unknown.dwarf_7a85::e_wouldBlock();
        } while (bVar2);
        this->isConnected = false;
        anon_unknown.dwarf_7a85::closeAndReset(sock);
        anon_unknown.dwarf_7a85::closeAndReset(&this->sd);
        if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
          piVar5 = __errno_location();
          std::function<void_(short)>::operator()(&this->errorCallback,(short)*piVar5);
        }
LAB_0010fed3:
        this_00 = std::
                  map<unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::function<unsigned_short_(const_char_*,_unsigned_int)>_>_>_>
                  ::operator[](&this->messageCallback,&local_2a);
        if ((this_00->super__Function_base)._M_manager == (_Manager_type)0x0) {
          return;
        }
        __args = (this->bufferDataRecv).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      std::function<unsigned_short_(const_char_*,_unsigned_int)>::operator()(this_00,__args,uVar6);
      return;
    }
    if (iVar3 != 0) {
      return;
    }
    this->isListening = false;
    this->isConnected = false;
  }
  anon_unknown.dwarf_7a85::closeAndReset(sock);
  anon_unknown.dwarf_7a85::closeAndReset(&this->sd);
  if ((this->errorCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
    return;
  }
  piVar5 = __errno_location();
  std::function<void_(short)>::operator()(&this->errorCallback,(short)*piVar5);
  return;
}

Assistant:

void doRead() {
            int rc = (int) recv(sdpeer, bufferHeaderRecv.data(), bufferHeaderRecv.size(), 0);
            if (rc < 0) {
                if (e_wouldBlock() == false) {
                    isConnected = false;
                    ::closeAndReset(sdpeer);
                    ::closeAndReset(sd);

                    TErrorCode errorCode = errno;
                    if (errorCallback) {
                        errorCallback(errorCode);
                    }
                }
                return;
            }

            if (rc == 0) {
                isConnected = false;
                isListening = false;
                ::closeAndReset(sdpeer);
                ::closeAndReset(sd);

                TErrorCode errorCode = errno;
                if (errorCallback) {
                    errorCallback(errorCode);
                }

                return;
            }

            //printf("  %d bytes received, %d %d\n", rc,
            //       (int)(*reinterpret_cast<int32_t *>(bufferHeaderRecv.data())),
            //       (int)(*reinterpret_cast<int16_t *>(bufferHeaderRecv.data() + sizeof(int32_t)))
            //       );

            if (rc == (int) bufferHeaderRecv.size()) {
                TBufferSize size = 0;
                TMessageType type = 0;
                memcpy(&size, bufferHeaderRecv.data(), sizeof(size));
                memcpy(&type, bufferHeaderRecv.data() + sizeof(size), sizeof(type));
                if (size == ::MessageHeader::getSizeInBytes()) {
                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), 0);
                    }
                } else if (size > ::MessageHeader::getSizeInBytes()) {
                    lastMessageType = type;
                    leftToReceive = size - ::MessageHeader::getSizeInBytes();
                    offsetReceive = 0;
                    if (leftToReceive > (int) bufferDataRecv.size()) {
                        printf("Extend receive buffer to %d bytes\n", (int) bufferDataRecv.size());
                        bufferDataRecv.resize(leftToReceive);
                    }

                    while (leftToReceive > 0) {
                        //printf("left = %d\n", (int) leftToReceive);
                        size_t curSize = (std::min)(65536, (int) leftToReceive);

                        int rc = (int) recv(sdpeer, bufferDataRecv.data() + offsetReceive, curSize, 0);
                        if (rc < 0) {
                            if (e_wouldBlock() == false) {
                                isConnected = false;
                                ::closeAndReset(sdpeer);
                                ::closeAndReset(sd);

                                if (errorCallback) {
                                    TErrorCode errorCode = errno;
                                    errorCallback(errorCode);
                                }

                                break;
                            }

                            continue;
                        }

                        if (rc == 0) {
                            isConnected = false;
                            isListening = false;
                            ::closeAndReset(sdpeer);
                            ::closeAndReset(sd);

                            TErrorCode errorCode = errno;
                            if (errorCallback) errorCallback(errorCode);

                            return;
                        }

                        leftToReceive -= rc;
                        offsetReceive += rc;
                    }

                    if (const auto & cb = messageCallback[type]) {
                        cb(bufferDataRecv.data(), size - ::MessageHeader::getSizeInBytes());
                    }
                } else {
                    // error
                }
            }
        }